

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLURL::parse(XMLURL *this,XMLCh *urlText)

{
  MemoryManager *manager;
  bool bVar1;
  Protocols PVar2;
  int iVar3;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  undefined4 extraout_var;
  XMLSize_t XVar6;
  XMLCh *pXVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  MalformedURLException *pMVar8;
  ArrayJanitor<char16_t> janSrcCopy;
  
  if (*urlText == L'\0') {
    pMVar8 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x3a8,URL_NoProtocolPresent,this->fMemoryManager);
LAB_0026ca9c:
    __cxa_throw(pMVar8,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  bVar1 = XMLUri::isURIString(urlText);
  this->fHasInvalidChar = !bVar1;
  if ((((ushort)((*urlText & 0xffdfU) - 0x41U) < 0x1a) && (urlText[1] == L':')) &&
     ((urlText[2] == L'\\' || (urlText[2] == L'/')))) {
    pMVar8 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x3bd,URL_NoProtocolPresent,this->fMemoryManager);
    goto LAB_0026ca9c;
  }
  pXVar4 = XMLString::replicate(urlText,this->fMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor(&janSrcCopy,pXVar4,this->fMemoryManager);
  while( true ) {
    if ((ulong)(ushort)*pXVar4 == 0) {
      pMVar8 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x3d6,URL_NoProtocolPresent,this->fMemoryManager);
      __cxa_throw(pMVar8,&MalformedURLException::typeinfo,XMLException::~XMLException);
    }
    if (-1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar4]) break;
    pXVar4 = pXVar4 + 1;
  }
  pXVar5 = XMLString::findAny(pXVar4,L":/");
  if ((pXVar5 != (XMLCh *)0x0) && (*pXVar5 == L':')) {
    *pXVar5 = L'\0';
    PVar2 = lookupByName(pXVar4);
    this->fProtocol = PVar2;
    if (PVar2 == Unknown) {
      pMVar8 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x3f3,URL_UnsupportedProto1,pXVar4,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
      goto LAB_0026cb12;
    }
    pXVar4 = pXVar5 + 1;
  }
  if ((*pXVar4 == L'/') && (pXVar4[1] == L'/')) {
    pXVar5 = pXVar4 + 2;
    if (pXVar4[2] != L'\0') {
      pXVar4 = XMLString::findAny(pXVar5,L"/");
      if (pXVar4 == (XMLCh *)0x0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
        pXVar4 = XMLString::replicate(pXVar5,this->fMemoryManager);
        this->fHost = pXVar4;
        XVar6 = XMLString::stringLen(pXVar4);
        pXVar5 = pXVar5 + XVar6;
      }
      else if ((long)pXVar4 - (long)pXVar5 != 0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
        iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                          (this->fMemoryManager,((long)pXVar4 - (long)pXVar5) + 2);
        pXVar7 = (XMLCh *)CONCAT44(extraout_var,iVar3);
        this->fHost = pXVar7;
        for (; pXVar5 < pXVar4; pXVar5 = pXVar5 + 1) {
          *pXVar7 = *pXVar5;
          pXVar7 = pXVar7 + 1;
        }
        *pXVar7 = L'\0';
      }
    }
  }
  else {
    pXVar5 = pXVar4;
    if (this->fProtocol == HTTP) {
      pMVar8 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x438,URL_ExpectingTwoSlashes,this->fMemoryManager);
      goto LAB_0026cb12;
    }
  }
  if (this->fHost == (XMLCh *)0x0) {
LAB_0026c8b0:
    if (*pXVar5 == L'\0') goto LAB_0026c9fc;
LAB_0026c8bb:
    pXVar4 = XMLString::findAny(pXVar5,L"#?");
    if (pXVar4 != (XMLCh *)0x0) {
      if (pXVar5 <= pXVar4 && (long)pXVar4 - (long)pXVar5 != 0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
        iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                          (this->fMemoryManager,((long)pXVar4 - (long)pXVar5) + 2);
        pXVar7 = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
        this->fPath = pXVar7;
        for (; pXVar5 < pXVar4; pXVar5 = pXVar5 + 1) {
          *pXVar7 = *pXVar5;
          pXVar7 = pXVar7 + 1;
        }
        *pXVar7 = L'\0';
      }
      if (*pXVar5 == L'#') {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fFragment);
        pXVar4 = XMLString::replicate(pXVar5 + 1,this->fMemoryManager);
      }
      else {
        pXVar5 = pXVar5 + 1;
        pXVar4 = XMLString::findAny(pXVar5,L"#");
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fQuery);
        manager = this->fMemoryManager;
        if (pXVar4 == (XMLCh *)0x0) {
          pXVar4 = XMLString::replicate(pXVar5,manager);
          this->fQuery = pXVar4;
          goto LAB_0026c9fc;
        }
        iVar3 = (*manager->_vptr_MemoryManager[3])(manager,(long)pXVar4 + (2 - (long)pXVar5));
        pXVar7 = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
        this->fQuery = pXVar7;
        for (; pXVar5 < pXVar4; pXVar5 = pXVar5 + 1) {
          *pXVar7 = *pXVar5;
          pXVar7 = pXVar7 + 1;
        }
        *pXVar7 = L'\0';
        if (*pXVar5 != L'#') goto LAB_0026c9fc;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fFragment);
        pXVar4 = XMLString::replicate(pXVar5 + 1,this->fMemoryManager);
      }
      this->fFragment = pXVar4;
      goto LAB_0026c9fc;
    }
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
    pXVar4 = XMLString::replicate(pXVar5,this->fMemoryManager);
  }
  else {
    pXVar4 = XMLString::findAny(this->fHost,L"@");
    if (pXVar4 != (XMLCh *)0x0) {
      *pXVar4 = L'\0';
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUser);
      pXVar7 = XMLString::replicate(this->fHost,this->fMemoryManager);
      this->fUser = pXVar7;
      XMLString::cut(this->fHost,(long)pXVar4 + (2 - (long)this->fHost) >> 1);
      pXVar4 = XMLString::findAny(this->fUser,L":");
      if (pXVar4 != (XMLCh *)0x0) {
        *pXVar4 = L'\0';
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPassword);
        pXVar4 = XMLString::replicate(pXVar4 + 1,this->fMemoryManager);
        this->fPassword = pXVar4;
      }
    }
    pXVar4 = XMLString::findAny(this->fHost,L":");
    if (pXVar4 != (XMLCh *)0x0) {
      *pXVar4 = L'\0';
      bVar1 = XMLString::textToBin(pXVar4 + 1,&this->fPortNum,this->fMemoryManager);
      if (!bVar1) {
        pMVar8 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar8,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                   ,0x46f,URL_BadPortField,this->fMemoryManager);
LAB_0026cb12:
        __cxa_throw(pMVar8,&MalformedURLException::typeinfo,XMLException::~XMLException);
      }
    }
    if (*this->fHost == L'\0') {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
      this->fHost = (XMLCh *)0x0;
      goto LAB_0026c8b0;
    }
    if (*pXVar5 != L'\0') goto LAB_0026c8bb;
    pXVar4 = XMLString::replicate(L"/",this->fMemoryManager);
  }
  this->fPath = pXVar4;
LAB_0026c9fc:
  ArrayJanitor<char16_t>::~ArrayJanitor(&janSrcCopy);
  return;
}

Assistant:

void XMLURL::parse(const XMLCh* const urlText)
{
    // Simplify things by checking for the psycho scenarios first
    if (!*urlText)
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);

    // Before we start, check if this urlText contains valid uri characters
    if (!XMLUri::isURIString(urlText))
        fHasInvalidChar = true;
    else
        fHasInvalidChar = false;

    //
    //  The first thing we will do is to check for a file name, so that
    //  we don't waste time thinking its a URL. If its in the form x:\ or x:/
    //  and x is an ASCII letter, then assume that's the deal.
    //
    if (((*urlText >= chLatin_A) && (*urlText <= chLatin_Z))
    ||  ((*urlText >= chLatin_a) && (*urlText <= chLatin_z)))
    {
        if (*(urlText + 1) == chColon)
        {
            if ((*(urlText + 2) == chForwardSlash)
            ||  (*(urlText + 2) == chBackSlash))
            {
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);
            }
        }
    }

    // Get a copy of the URL that we can modify
    XMLCh* srcCpy = XMLString::replicate(urlText, fMemoryManager);
    ArrayJanitor<XMLCh> janSrcCopy(srcCpy, fMemoryManager);

    //
    //  Get a pointer now that we can run up thrown the source as we parse
    //  bits and pieces out of it.
    //
    XMLCh* srcPtr = srcCpy;

    // Run up past any spaces
    while (*srcPtr)
    {
        if (!XMLChar1_0::isWhitespace(*srcPtr))
            break;
        srcPtr++;
    }

    // Make sure it wasn't all space
    if (!*srcPtr)
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);

    //
    //  Ok, the next thing we have to do is to find either a / or : character.
    //  If the : is first, we assume we have a protocol. If the / is first,
    //  then we skip to the host processing.
    //
    XMLCh* ptr1 = XMLString::findAny(srcPtr, gListOne);
    XMLCh* ptr2;

    // If we found a protocol, then deal with it
    if (ptr1)
    {
        if (*ptr1 == chColon)
        {
            // Cap the string at the colon
            *ptr1 = 0;

            // And try to find it in our list of protocols
            fProtocol = lookupByName(srcPtr);

            if (fProtocol == Unknown)
            {
                ThrowXMLwithMemMgr1
                (
                    MalformedURLException
                    , XMLExcepts::URL_UnsupportedProto1
                    , srcPtr
                    , fMemoryManager
                );
            }

            // And move our source pointer up past what we've processed
            srcPtr = (ptr1 + 1);
        }
    }

    //
    //  Ok, next we need to see if we have any host part. If the next
    //  two characters are //, then we need to check, else move on.
    //
    if ((*srcPtr == chForwardSlash) && (*(srcPtr + 1) == chForwardSlash))
    {
        // Move up past the slashes
        srcPtr += 2;

        //
        //  If we aren't at the end of the string, then there has to be a
        //  host part at this point. we will just look for the next / char
        //  or end of string and make all of that the host for now.
        //
        if (*srcPtr)
        {
            // Search from here for a / character
            ptr1 = XMLString::findAny(srcPtr, gListFour);

            //
            //  If we found something, then the host is between where
            //  we are and what we found. Else the host is the rest of
            //  the content and we are done. If its empty, leave it null.
            //
            if (ptr1)
            {
                if (ptr1 != srcPtr)
                {
                    fMemoryManager->deallocate(fHost);//delete [] fHost;
                    fHost = (XMLCh*) fMemoryManager->allocate
                    (
                        ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
                    );//new XMLCh[(ptr1 - srcPtr) + 1];
                    ptr2 = fHost;
                    while (srcPtr < ptr1)
                        *ptr2++ = *srcPtr++;
                    *ptr2 = 0;
                }
            }
             else
            {
                fMemoryManager->deallocate(fHost);//delete [] fHost;
                fHost = XMLString::replicate(srcPtr, fMemoryManager);

                // Update source pointer to the end
                srcPtr += XMLString::stringLen(fHost);
            }
        }
    }
    else
    {
        //
        // http protocol requires two forward slashes
        // we didn't get them, so throw an exception
        //
        if (fProtocol == HTTP) {
            ThrowXMLwithMemMgr
                (
                    MalformedURLException
                    , XMLExcepts::URL_ExpectingTwoSlashes
                    , fMemoryManager
                );
        }
    }

    //
    //  If there was a host part, then we have to grovel through it for
    //  all the bits and pieces it can hold.
    //
    if (fHost)
    {
        //
        //  Look for a '@' character, which indicates a user name. If we
        //  find one, then everything between the start of the host data
        //  and the character is the user name.
        //
        ptr1 = XMLString::findAny(fHost, gListTwo);
        if (ptr1)
        {
            // Get this info out as the user name
            *ptr1 = 0;
            fMemoryManager->deallocate(fUser);//delete [] fUser;
            fUser = XMLString::replicate(fHost, fMemoryManager);
            ptr1++;

            // And now cut these chars from the host string
            XMLString::cut(fHost, ptr1 - fHost);

            // Is there a password inside the user string?
            ptr2 = XMLString::findAny(fUser, gListThree);
            if (ptr2)
            {
                // Remove it from the user name string
                *ptr2 = 0;

                // And copy out the remainder to the password field
                ptr2++;
                fMemoryManager->deallocate(fPassword);//delete [] fPassword;
                fPassword = XMLString::replicate(ptr2, fMemoryManager);
            }
        }

        //
        //  Ok, so now we are at the actual host name, if any. If we are
        //  not at the end of the host data, then lets see if we have a
        //  port trailing the
        //
        ptr1 = XMLString::findAny(fHost, gListThree);
        if (ptr1)
        {
            // Remove it from the host name
            *ptr1 = 0;

            // Try to convert it to a numeric port value and store it
            ptr1++;
            if (!XMLString::textToBin(ptr1, fPortNum, fMemoryManager))
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_BadPortField, fMemoryManager);
        }

        // If the host ended up empty, then toss is
        if (!*fHost)
        {
            fMemoryManager->deallocate(fHost);//delete[] fHost;
            fHost = 0;
        }
    }

    // If we are at the end, then we are done now
    if (!*srcPtr) {
        if(fHost) {
            static const XMLCh slash[] = { chForwardSlash, chNull };
            fPath = XMLString::replicate(slash, fMemoryManager);
        }
        return;
    }

    //
    //  Next is the path part. It can be absolute, i.e. starting with a
    //  forward slash character, or relative. Its basically everything up
    //  to the end of the string or to any trailing query or fragment.
    //
    ptr1 = XMLString::findAny(srcPtr, gListFive);
    if (!ptr1)
    {
        fMemoryManager->deallocate(fPath);//delete [] fPath;
        fPath = XMLString::replicate(srcPtr, fMemoryManager);
        return;
    }

    // Everything from where we are to what we found is the path
    if (ptr1 > srcPtr)
    {
        fMemoryManager->deallocate(fPath);//delete [] fPath;
        fPath = (XMLCh*) fMemoryManager->allocate
        (
            ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
        );//new XMLCh[(ptr1 - srcPtr) + 1];
        ptr2 = fPath;
        while (srcPtr < ptr1)
            *ptr2++ = *srcPtr++;
        *ptr2 = 0;
    }

    //
    //  If we found a fragment, then it is the rest of the string and we
    //  are done.
    //
    if (*srcPtr == chPound)
    {
        srcPtr++;
        fMemoryManager->deallocate(fFragment);//delete [] fFragment;
        fFragment = XMLString::replicate(srcPtr, fMemoryManager);
        return;
    }

    //
    //  The query is either the rest of the string, or up to the fragment
    //  separator.
    //
    srcPtr++;
    ptr1 = XMLString::findAny(srcPtr, gListSix);
    fMemoryManager->deallocate(fQuery);//delete [] fQuery;
    if (!ptr1)
    {
        fQuery = XMLString::replicate(srcPtr, fMemoryManager);
        return;
    }
     else
    {
        fQuery = (XMLCh*) fMemoryManager->allocate
        (
            ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
        );//new XMLCh[(ptr1 - srcPtr) + 1];
        ptr2 = fQuery;
        while (srcPtr < ptr1)
            *ptr2++ = *srcPtr++;
        *ptr2 = 0;
    }

    // If we are not at the end now, then everything else is the fragment
    if (*srcPtr == chPound)
    {
        srcPtr++;
        fMemoryManager->deallocate(fFragment);//delete [] fFragment;
        fFragment = XMLString::replicate(srcPtr, fMemoryManager);
    }
}